

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O1

handle pybind11::detail::
       list_caster<std::vector<std::tuple<double,double,double>,std::allocator<std::tuple<double,double,double>>>,std::tuple<double,double,double>>
       ::
       cast<std::vector<std::tuple<double,double,double>,std::allocator<std::tuple<double,double,double>>>>
                 (vector<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
                  *src,return_value_policy policy,handle parent)

{
  pointer ptVar1;
  handle hVar2;
  long lVar3;
  PyObject *tmp;
  pointer ptVar4;
  list l;
  object value_;
  handle local_40;
  handle local_38;
  
  list::list((list *)&local_40,
             ((long)(src->
                    super__Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(src->
                    super__Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  ptVar4 = (src->
           super__Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ptVar1 = (src->
           super__Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (ptVar4 != ptVar1) {
    lVar3 = 0;
    do {
      hVar2 = tuple_caster<std::tuple,double,double,double>::
              cast_impl<std::tuple<double,double,double>,0ul,1ul,2ul>(ptVar4,policy,parent.m_ptr);
      local_38 = hVar2;
      if (hVar2.m_ptr != (PyObject *)0x0) {
        local_38.m_ptr = (PyObject *)0x0;
        if (((local_40.m_ptr)->ob_type->tp_flags & 0x2000000) == 0) {
          __assert_fail("PyList_Check(l.ptr())",
                        "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/pybind11/include/pybind11/stl.h"
                        ,0xb2,
                        "static handle pybind11::detail::list_caster<std::vector<std::tuple<double, double, double>>, std::tuple<double, double, double>>::cast(T &&, return_value_policy, handle) [Type = std::vector<std::tuple<double, double, double>>, Value = std::tuple<double, double, double>, T = std::vector<std::tuple<double, double, double>>]"
                       );
        }
        (&((local_40.m_ptr[1].ob_type)->ob_base).ob_base.ob_refcnt)[lVar3] = (Py_ssize_t)hVar2.m_ptr
        ;
        lVar3 = lVar3 + 1;
      }
      object::~object((object *)&local_38);
      if (hVar2.m_ptr == (PyObject *)0x0) {
        hVar2.m_ptr = (PyObject *)0x0;
        goto LAB_001df19a;
      }
      ptVar4 = ptVar4 + 1;
    } while (ptVar4 != ptVar1);
  }
  hVar2.m_ptr = local_40.m_ptr;
  local_40.m_ptr = (PyObject *)0x0;
LAB_001df19a:
  object::~object((object *)&local_40);
  return (handle)hVar2.m_ptr;
}

Assistant:

static handle cast(T &&src, return_value_policy policy, handle parent) {
        if (!std::is_lvalue_reference<T>::value)
            policy = return_value_policy_override<Value>::policy(policy);
        list l(src.size());
        size_t index = 0;
        for (auto &&value : src) {
            auto value_ = reinterpret_steal<object>(value_conv::cast(forward_like<T>(value), policy, parent));
            if (!value_)
                return handle();
            PyList_SET_ITEM(l.ptr(), (ssize_t) index++, value_.release().ptr()); // steals a reference
        }
        return l.release();
    }